

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O1

void __thiscall
MeCab::scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~scoped_ptr(scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  ~scoped_ptr(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~scoped_ptr() { delete ptr_; }